

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void m68k_tr_tb_stop(DisasContextBase_conflict1 *dcbase,CPUState *cpu)

{
  TCGContext_conflict2 *tcg_ctx;
  
  if (3 < dcbase->is_jmp - DISAS_TOO_MANY) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
               ,0x190d,(char *)0x0);
  }
  tcg_ctx = *(TCGContext_conflict2 **)(*(long *)&dcbase[6].is_jmp + 0x2e8);
  switch(dcbase->is_jmp) {
  case DISAS_TOO_MANY:
    update_cc_op((DisasContext_conflict2 *)dcbase);
    if (dcbase->singlestep_enabled != true) {
      gen_jmp_tb((DisasContext_conflict2 *)dcbase,0,dcbase[1].pc_first);
      return;
    }
    tcg_gen_movi_i32(tcg_ctx,QREG_PC,dcbase[1].pc_first);
    break;
  case DISAS_NORETURN:
    return;
  case DISAS_TARGET_0:
    if (dcbase->singlestep_enabled != true) {
      tcg_gen_lookup_and_goto_ptr_m68k(tcg_ctx);
      return;
    }
    break;
  case DISAS_TARGET_1:
    if (dcbase->singlestep_enabled != true) {
      tcg_gen_exit_tb_m68k(tcg_ctx,(TranslationBlock *)0x0,0);
      return;
    }
  }
  gen_raise_exception(tcg_ctx,0x10002);
  return;
}

Assistant:

static void m68k_tr_tb_stop(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;

    switch (dc->base.is_jmp) {
    case DISAS_NORETURN:
        break;
    case DISAS_TOO_MANY:
        update_cc_op(dc);
        if (dc->base.singlestep_enabled) {
            tcg_gen_movi_i32(tcg_ctx, QREG_PC, dc->pc);
            gen_raise_exception(tcg_ctx, EXCP_DEBUG);
        } else {
            gen_jmp_tb(dc, 0, dc->pc);
        }
        break;
    case DISAS_JUMP:
        /* We updated CC_OP and PC in gen_jmp/gen_jmp_im.  */
        if (dc->base.singlestep_enabled) {
            gen_raise_exception(tcg_ctx, EXCP_DEBUG);
        } else {
            tcg_gen_lookup_and_goto_ptr(tcg_ctx);
        }
        break;
    case DISAS_EXIT:
        /*
         * We updated CC_OP and PC in gen_exit_tb, but also modified
         * other state that may require returning to the main loop.
         */
        if (dc->base.singlestep_enabled) {
            gen_raise_exception(tcg_ctx, EXCP_DEBUG);
        } else {
            tcg_gen_exit_tb(tcg_ctx, NULL, 0);
        }
        break;
    default:
        g_assert_not_reached();
    }
}